

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestTestHandler::SetTestsProperties
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCTest *this_00;
  double dVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  reference pbVar5;
  reference __lhs;
  reference __rhs;
  iterator iVar6;
  iterator iVar7;
  long lVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  ostream *this_01;
  void *this_02;
  char *pcVar11;
  reference pvVar12;
  reference pbVar13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var15;
  string_view sVar16;
  string *cr_3;
  iterator __end33;
  iterator __begin33;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range33;
  undefined1 local_f08 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_7;
  rep_conflict local_ee8;
  string local_ee0 [32];
  undefined1 local_ec0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_d38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propArgs;
  string *cr_2;
  iterator __end30;
  iterator __begin30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range30;
  undefined1 local_c90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_6;
  string local_c48 [8];
  string mVal;
  string mKey;
  size_t pos;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_bc8;
  const_iterator local_bc0;
  const_iterator local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ba8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ba0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  new_end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b70;
  const_iterator local_b68;
  string_view local_b60;
  undefined1 local_b50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Labels;
  string *cr_1;
  iterator __end20;
  iterator __begin20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range20;
  undefined1 local_948 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_5;
  string *cr;
  iterator __end19;
  iterator __begin19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range19;
  undefined1 local_8d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_4;
  double local_7d8;
  rep_conflict local_7d0;
  basic_string_view<char,_std::char_traits<char>_> local_7c8;
  basic_string_view<char,_std::char_traits<char>_> local_7b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_798;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_790;
  string_view local_788;
  undefined1 local_778 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_3;
  undefined1 local_710 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_2;
  undefined1 local_6a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval_1;
  undefined1 local_640 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lval;
  cmListFileContext local_4f8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_488;
  long local_478;
  long line;
  cmListFileContext fc;
  size_t i;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  undefined1 local_3e8 [8];
  cmState state;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  triples;
  cmCTestTestProperties *rt;
  iterator __end3;
  iterator __begin3;
  ListOfTests *__range3;
  string *t;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *val;
  reference local_78;
  string *key;
  undefined4 local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  byte local_41;
  undefined1 local_40 [7];
  bool found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestTestHandler *this_local;
  
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&tests.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  local_41 = 0;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(args);
  tests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_50;
  while( true ) {
    local_58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
    if (!bVar2) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&tests.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator==(pbVar5,"PROPERTIES");
    if (bVar2) {
      local_41 = 1;
      break;
    }
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&tests.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,pbVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&tests.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if ((local_41 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&tests.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      key = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(args);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&tests.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&key);
      if (!bVar2) break;
      local_78 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&tests.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&tests.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      val = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(args);
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&tests.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&val);
      if (bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&tests.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
      t = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&t);
        if (!bVar2) break;
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
        __end3 = std::
                 vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ::begin(&this->TestList);
        rt = (cmCTestTestProperties *)
             std::
             vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ::end(&this->TestList);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                                      *)&rt);
          if (!bVar2) break;
          __rhs = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                  ::operator*(&__end3);
          _Var3 = std::operator==(__lhs,&__rhs->Name);
          if (_Var3) {
            _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
            bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                     ::cm::operator____s("_BACKTRACE_TRIPLES",0x12);
            triples.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bVar14._M_len;
            bVar2 = std::operator==(_Var15,bVar14);
            if (bVar2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_110);
              sVar16 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
              state._704_8_ = sVar16._M_len;
              cmExpandList(sVar16,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_110,true);
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_110);
              if (sVar10 % 3 == 0) {
                cmState::cmState((cmState *)local_3e8,Unknown,Normal);
                i = 0;
                _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&i);
                cmListFileBacktrace::operator=(&__rhs->Backtrace,(cmListFileBacktrace *)&i);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&i);
                fc.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_ = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_110);
                for (; 2 < (ulong)fc.DeferId.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._32_8_;
                    fc.DeferId.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_ = fc.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._32_8_ + -3) {
                  cmListFileContext::cmListFileContext((cmListFileContext *)&line);
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_110,
                                         fc.DeferId.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._32_8_ - 3);
                  std::__cxx11::string::operator=
                            ((string *)(fc.Name.field_2._M_local_buf + 8),(string *)pvVar12);
                  local_478 = 0;
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_110,
                                         fc.DeferId.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._32_8_ - 2);
                  bVar2 = cmStrToLong(pvVar12,&local_478);
                  if (!bVar2) {
                    local_478 = 0;
                  }
                  fc.FilePath.field_2._8_8_ = local_478;
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_110,
                                         fc.DeferId.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._32_8_ - 1);
                  std::__cxx11::string::operator=((string *)&line,(string *)pvVar12);
                  cmListFileContext::cmListFileContext(&local_4f8,(cmListFileContext *)&line);
                  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                            (&local_488,(cmListFileContext *)&__rhs->Backtrace);
                  cmListFileBacktrace::operator=
                            (&__rhs->Backtrace,(cmListFileBacktrace *)&local_488);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_488);
                  cmListFileContext::~cmListFileContext(&local_4f8);
                  cmListFileContext::~cmListFileContext((cmListFileContext *)&line);
                }
                cmState::~cmState((cmState *)local_3e8);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_110);
            }
            else {
              _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
              bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                       ::cm::operator____s("WILL_FAIL",9);
              bVar2 = std::operator==(_Var15,bVar14);
              if (bVar2) {
                sVar16 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar5);
                bVar2 = cmIsOn(sVar16);
                __rhs->WillFail = bVar2;
              }
              else {
                _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)local_78);
                bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                         ::cm::operator____s("DISABLED",8);
                bVar2 = std::operator==(_Var15,bVar14);
                if (bVar2) {
                  sVar16 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)pbVar5);
                  bVar2 = cmIsOn(sVar16);
                  __rhs->Disabled = bVar2;
                }
                else {
                  _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)local_78);
                  bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                           ::cm::operator____s("ATTACHED_FILES",0xe);
                  bVar2 = std::operator==(_Var15,bVar14);
                  if (bVar2) {
                    sVar16 = (string_view)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)pbVar5);
                    cmExpandList(sVar16,&__rhs->AttachedFiles,false);
                  }
                  else {
                    _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                             std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)local_78);
                    bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                             ::cm::operator____s("ATTACHED_FILES_ON_FAIL",0x16);
                    bVar2 = std::operator==(_Var15,bVar14);
                    if (bVar2) {
                      sVar16 = (string_view)
                               std::__cxx11::string::operator_cast_to_basic_string_view
                                         ((string *)pbVar5);
                      cmExpandList(sVar16,&__rhs->AttachOnFail,false);
                    }
                    else {
                      _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                               std::__cxx11::string::operator_cast_to_basic_string_view
                                         ((string *)local_78);
                      bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                               ::cm::operator____s("RESOURCE_LOCK",0xd);
                      lval.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bVar14._M_len;
                      bVar2 = std::operator==(_Var15,bVar14);
                      if (bVar2) {
                        sVar16 = (string_view)
                                 std::__cxx11::string::operator_cast_to_basic_string_view
                                           ((string *)pbVar5);
                        cmExpandedList_abi_cxx11_
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_640,sVar16,false);
                        iVar6 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_640);
                        iVar7 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_640);
                        std::
                        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::
                        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    *)&__rhs->LockedResources,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )iVar6._M_current,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )iVar7._M_current);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_640);
                      }
                      else {
                        _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                 std::__cxx11::string::operator_cast_to_basic_string_view
                                           ((string *)local_78);
                        bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                 ::cm::operator____s("FIXTURES_SETUP",0xe);
                        lval_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bVar14._M_len;
                        bVar2 = std::operator==(_Var15,bVar14);
                        if (bVar2) {
                          sVar16 = (string_view)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)pbVar5);
                          cmExpandedList_abi_cxx11_
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_6a8,sVar16,false);
                          iVar6 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_6a8);
                          iVar7 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_6a8);
                          std::
                          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::
                          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&__rhs->FixturesSetup,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )iVar6._M_current,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )iVar7._M_current);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_6a8);
                        }
                        else {
                          _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                                   std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)local_78);
                          bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                   ::cm::operator____s("FIXTURES_CLEANUP",0x10);
                          lval_2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)bVar14._M_len;
                          bVar2 = std::operator==(_Var15,bVar14);
                          if (bVar2) {
                            sVar16 = (string_view)
                                     std::__cxx11::string::operator_cast_to_basic_string_view
                                               ((string *)pbVar5);
                            cmExpandedList_abi_cxx11_
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_710,sVar16,false);
                            iVar6 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_710);
                            iVar7 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_710);
                            std::
                            set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::
                            insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&__rhs->FixturesCleanup,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )iVar6._M_current,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )iVar7._M_current);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_710);
                          }
                          else {
                            _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                      )std::__cxx11::string::operator_cast_to_basic_string_view
                                                 ((string *)local_78);
                            bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                     ::cm::operator____s("FIXTURES_REQUIRED",0x11);
                            lval_3.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 (pointer)bVar14._M_len;
                            bVar2 = std::operator==(_Var15,bVar14);
                            if (bVar2) {
                              sVar16 = (string_view)
                                       std::__cxx11::string::operator_cast_to_basic_string_view
                                                 ((string *)pbVar5);
                              local_788 = sVar16;
                              cmExpandedList_abi_cxx11_
                                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_778,sVar16,false);
                              local_790._M_current =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_778);
                              local_798 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_778);
                              std::
                              set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::
                              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                        ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)&__rhs->FixturesRequired,local_790,
                                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          )local_798);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_778);
                            }
                            else {
                              _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                        )std::__cxx11::string::operator_cast_to_basic_string_view
                                                   ((string *)local_78);
                              local_7a8 = _Var15;
                              bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                       ::cm::operator____s("TIMEOUT",7);
                              local_7c8 = bVar14;
                              local_7b8 = bVar14;
                              bVar2 = std::operator==(local_7a8,bVar14);
                              if (bVar2) {
                                pcVar11 = (char *)std::__cxx11::string::c_str();
                                local_7d8 = atof(pcVar11);
                                std::chrono::duration<double,std::ratio<1l,1l>>::
                                duration<double,void>
                                          ((duration<double,std::ratio<1l,1l>> *)&local_7d0,
                                           &local_7d8);
                                (__rhs->Timeout).__r = local_7d0;
                                __rhs->ExplicitTimeout = true;
                              }
                              else {
                                _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                          )std::__cxx11::string::operator_cast_to_basic_string_view
                                                     ((string *)local_78);
                                bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                         ::cm::operator____s("COST",4);
                                bVar2 = std::operator==(_Var15,bVar14);
                                if (bVar2) {
                                  pcVar11 = (char *)std::__cxx11::string::c_str();
                                  dVar1 = atof(pcVar11);
                                  __rhs->Cost = (float)dVar1;
                                }
                                else {
                                  _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                            )std::__cxx11::string::
                                             operator_cast_to_basic_string_view((string *)local_78);
                                  bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                           ::cm::operator____s("REQUIRED_FILES",0xe);
                                  bVar2 = std::operator==(_Var15,bVar14);
                                  if (bVar2) {
                                    sVar16 = (string_view)
                                             std::__cxx11::string::
                                             operator_cast_to_basic_string_view((string *)pbVar5);
                                    cmExpandList(sVar16,&__rhs->RequiredFiles,false);
                                  }
                                  else {
                                    _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                              )std::__cxx11::string::
                                               operator_cast_to_basic_string_view
                                                         ((string *)local_78);
                                    bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                             ::cm::operator____s("RUN_SERIAL",10);
                                    bVar2 = std::operator==(_Var15,bVar14);
                                    if (bVar2) {
                                      sVar16 = (string_view)
                                               std::__cxx11::string::
                                               operator_cast_to_basic_string_view((string *)pbVar5);
                                      bVar2 = cmIsOn(sVar16);
                                      __rhs->RunSerial = bVar2;
                                    }
                                    else {
                                      _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                )std::__cxx11::string::
                                                 operator_cast_to_basic_string_view
                                                           ((string *)local_78);
                                      bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                               ::cm::operator____s("FAIL_REGULAR_EXPRESSION",0x17);
                                      lval_4.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)bVar14._M_len;
                                      bVar2 = std::operator==(_Var15,bVar14);
                                      if (bVar2) {
                                        sVar16 = (string_view)
                                                 std::__cxx11::string::
                                                 operator_cast_to_basic_string_view
                                                           ((string *)pbVar5);
                                        cmExpandedList_abi_cxx11_
                                                  ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_8d0,sVar16,false);
                                        __end19 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_8d0);
                                        cr = (string *)
                                             std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_8d0);
                                        while( true ) {
                                          bVar2 = __gnu_cxx::operator!=
                                                            (&__end19,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&cr);
                                          if (!bVar2) break;
                                          pbVar13 = __gnu_cxx::
                                                                                                        
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end19);
                                          std::
                                          vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                          ::
                                          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                    ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->ErrorRegularExpressions,pbVar13,pbVar13)
                                          ;
                                          __gnu_cxx::
                                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::operator++(&__end19);
                                        }
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_8d0);
                                      }
                                      else {
                                        _Var15 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                        bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                                                 ::cm::operator____s("SKIP_REGULAR_EXPRESSION",0x17)
                                        ;
                                        lval_5.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)bVar14._M_len;
                                        bVar2 = std::operator==(_Var15,bVar14);
                                        if (bVar2) {
                                          sVar16 = (string_view)
                                                   std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)pbVar5);
                                          cmExpandedList_abi_cxx11_
                                                    ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_948,sVar16,false);
                                          __end20 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_948);
                                          cr_1 = (string *)
                                                 std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_948);
                                          while( true ) {
                                            bVar2 = __gnu_cxx::operator!=
                                                              (&__end20,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&cr_1);
                                            if (!bVar2) break;
                                            pbVar13 = __gnu_cxx::
                                                                                                            
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end20);
                                            std::
                                            vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                            ::
                                            emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                      ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->SkipRegularExpressions,pbVar13,pbVar13);
                                            __gnu_cxx::
                                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator++(&__end20);
                                          }
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_948);
                                        }
                                        else {
                                          _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                          bVar14 = (basic_string_view<char,_std::char_traits<char>_>
                                                   )::cm::operator____s("PROCESSORS",10);
                                          bVar2 = std::operator==(_Var15,bVar14);
                                          if (bVar2) {
                                            pcVar11 = (char *)std::__cxx11::string::c_str();
                                            iVar4 = atoi(pcVar11);
                                            __rhs->Processors = iVar4;
                                            if (__rhs->Processors < 1) {
                                              __rhs->Processors = 1;
                                            }
                                          }
                                          else {
                                            _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                            bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("PROCESSOR_AFFINITY",0x12);
                                            bVar2 = std::operator==(_Var15,bVar14);
                                            if (bVar2) {
                                              sVar16 = (string_view)
                                                       std::__cxx11::string::
                                                       operator_cast_to_basic_string_view
                                                                 ((string *)pbVar5);
                                              bVar2 = cmIsOn(sVar16);
                                              __rhs->WantAffinity = bVar2;
                                            }
                                            else {
                                              _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                              bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("RESOURCE_GROUPS",0xf);
                                              bVar2 = std::operator==(_Var15,bVar14);
                                              if (bVar2) {
                                                bVar2 = ParseResourceGroupsProperty
                                                                  (pbVar5,&__rhs->ResourceGroups);
                                                if (!bVar2) {
                                                  this_local._7_1_ = false;
                                                  goto LAB_00236007;
                                                }
                                              }
                                              else {
                                                _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("SKIP_RETURN_CODE",0x10);
                                                bVar2 = std::operator==(_Var15,bVar14);
                                                if (bVar2) {
                                                  pcVar11 = (char *)std::__cxx11::string::c_str();
                                                  iVar4 = atoi(pcVar11);
                                                  __rhs->SkipReturnCode = iVar4;
                                                  if ((__rhs->SkipReturnCode < 0) ||
                                                     (0xff < __rhs->SkipReturnCode)) {
                                                    __rhs->SkipReturnCode = -1;
                                                  }
                                                }
                                                else {
                                                  _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("DEPENDS",7);
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    cmExpandList(sVar16,&__rhs->Depends,false);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("ENVIRONMENT",0xb);
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    cmExpandList(sVar16,&__rhs->Environment,false);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("ENVIRONMENT_MODIFICATION",
                                                                      0x18);
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    cmExpandList(sVar16,&__rhs->
                                                  EnvironmentModification,false);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("LABELS",6);
                                                  Labels.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)bVar14._M_len;
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    local_b60 = sVar16;
                                                    cmExpandedList_abi_cxx11_
                                                              ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_b50,sVar16,false);
                                                  local_b70._M_current =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end(&__rhs->Labels);
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::__normal_iterator<std::__cxx11::string*>
                                                            ((
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  *)&local_b68,&local_b70);
                                                  iVar6 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_b50);
                                                  iVar7 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_b50);
                                                  std::
                                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  ::
                                                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                                            ((
                                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  *)&__rhs->Labels,local_b68,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )iVar6._M_current,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )iVar7._M_current);
                                                  iVar6 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin(&__rhs->Labels);
                                                  new_end._M_current =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end(&__rhs->Labels);
                                                  std::
                                                  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                            ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )iVar6._M_current,new_end);
                                                  local_ba8._M_current =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin(&__rhs->Labels);
                                                  local_bb0 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end(&__rhs->Labels);
                                                  local_ba0 = std::
                                                  unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                            (local_ba8,
                                                             (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_bb0);
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::__normal_iterator<std::__cxx11::string*>
                                                            ((
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  *)&local_bb8,&local_ba0);
                                                  local_bc8._M_current =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end(&__rhs->Labels);
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::__normal_iterator<std::__cxx11::string*>
                                                            ((
                                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  *)&local_bc0,&local_bc8);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::erase(&__rhs->Labels,local_bb8,local_bc0);
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_b50);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("MEASUREMENT",0xb);
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    lVar8 = std::__cxx11::string::find_first_of
                                                                      ((char)pbVar5,0x3d);
                                                    if (lVar8 == -1) {
                                                      pmVar9 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&__rhs->Measurements,pbVar5);
                                                  std::__cxx11::string::operator=
                                                            ((string *)pmVar9,"1");
                                                  }
                                                  else {
                                                    std::__cxx11::string::substr
                                                              ((ulong)((long)&mVal.field_2 + 8),
                                                               (ulong)pbVar5);
                                                    std::__cxx11::string::substr
                                                              ((ulong)local_c48,(ulong)pbVar5);
                                                    pmVar9 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&__rhs->Measurements,
                                                               (key_type *)((long)&mVal.field_2 + 8)
                                                              );
                                                  std::__cxx11::string::operator=
                                                            ((string *)pmVar9,local_c48);
                                                  std::__cxx11::string::~string(local_c48);
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             (mVal.field_2._M_local_buf + 8));
                                                  }
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("PASS_REGULAR_EXPRESSION",0x17
                                                                     );
                                                  lval_6.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)bVar14._M_len;
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    cmExpandedList_abi_cxx11_
                                                              ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_c90,sVar16,false);
                                                  __end30 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_c90);
                                                  cr_2 = (string *)
                                                         std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_c90);
                                                  while( true ) {
                                                    bVar2 = __gnu_cxx::operator!=
                                                                      (&__end30,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&cr_2);
                                                  if (!bVar2) break;
                                                  pbVar13 = __gnu_cxx::
                                                                                                                        
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end30);
                                                  std::
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                            ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->RequiredRegularExpressions,pbVar13,
                                                  pbVar13);
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator++(&__end30);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_c90);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("WORKING_DIRECTORY",0x11);
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)&__rhs->Directory,
                                                               (string *)pbVar5);
                                                  }
                                                  else {
                                                    _Var15 = (
                                                  __type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                                  )std::__cxx11::string::
                                                   operator_cast_to_basic_string_view
                                                             ((string *)local_78);
                                                  bVar14 = (
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  ::cm::operator____s("TIMEOUT_AFTER_MATCH",0x13);
                                                  propArgs.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)bVar14._M_len;
                                                  bVar2 = std::operator==(_Var15,bVar14);
                                                  if (bVar2) {
                                                    sVar16 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)pbVar5);
                                                    cmExpandedList_abi_cxx11_
                                                              ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38,sVar16,false);
                                                  sVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38);
                                                  if (sVar10 == 2) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38,0);
                                                  pcVar11 = (char *)std::__cxx11::string::c_str();
                                                  lval_7.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)atof(pcVar11);
                                                  std::chrono::duration<double,std::ratio<1l,1l>>::
                                                  duration<double,void>
                                                            ((duration<double,std::ratio<1l,1l>> *)
                                                             &local_ee8,
                                                             (double *)
                                                             &lval_7.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  (__rhs->AlternateTimeout).__r = local_ee8;
                                                  pvVar12 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38,1);
                                                  sVar16 = (string_view)
                                                           std::__cxx11::string::
                                                           operator_cast_to_basic_string_view
                                                                     ((string *)pvVar12);
                                                  cmExpandedList_abi_cxx11_
                                                            ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_f08,sVar16,false);
                                                  __end33 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_f08);
                                                  cr_3 = (string *)
                                                         std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_f08);
                                                  while( true ) {
                                                    bVar2 = __gnu_cxx::operator!=
                                                                      (&__end33,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&cr_3);
                                                  if (!bVar2) break;
                                                  pbVar13 = __gnu_cxx::
                                                                                                                        
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end33);
                                                  std::
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  ::
                                                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                                            ((
                                                  vector<std::pair<cmsys::RegularExpression,std::__cxx11::string>,std::allocator<std::pair<cmsys::RegularExpression,std::__cxx11::string>>>
                                                  *)&__rhs->TimeoutRegularExpressions,pbVar13,
                                                  pbVar13);
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator++(&__end33);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_f08);
                                                  }
                                                  else {
                                                    std::__cxx11::ostringstream::ostringstream
                                                              ((ostringstream *)local_ec0);
                                                    this_01 = std::operator<<((ostream *)local_ec0,
                                                                                                                                                            
                                                  "TIMEOUT_AFTER_MATCH expects two arguments, found "
                                                  );
                                                  sVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38);
                                                  this_02 = (void *)std::ostream::operator<<
                                                                              (this_01,sVar10);
                                                  std::ostream::operator<<
                                                            (this_02,std::
                                                  endl<char,std::char_traits<char>>);
                                                  this_00 = (this->super_cmCTestGenericHandler).
                                                            CTest;
                                                  std::__cxx11::ostringstream::str();
                                                  pcVar11 = (char *)std::__cxx11::string::c_str();
                                                  cmCTest::Log(this_00,6,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                                  ,0x912,pcVar11,false);
                                                  std::__cxx11::string::~string(local_ee0);
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)local_ec0);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d38);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
          ::operator++(&__end3);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&tests.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = true;
  }
LAB_00236007:
  local_68 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmCTestTestHandler::SetTestsProperties(
  const std::vector<std::string>& args)
{
  std::vector<std::string>::const_iterator it;
  std::vector<std::string> tests;
  bool found = false;
  for (it = args.begin(); it != args.end(); ++it) {
    if (*it == "PROPERTIES") {
      found = true;
      break;
    }
    tests.push_back(*it);
  }
  if (!found) {
    return false;
  }
  ++it; // skip PROPERTIES
  for (; it != args.end(); ++it) {
    std::string const& key = *it;
    ++it;
    if (it == args.end()) {
      break;
    }
    std::string const& val = *it;
    for (std::string const& t : tests) {
      for (cmCTestTestProperties& rt : this->TestList) {
        if (t == rt.Name) {
          if (key == "_BACKTRACE_TRIPLES"_s) {
            std::vector<std::string> triples;
            // allow empty args in the triples
            cmExpandList(val, triples, true);

            // Ensure we have complete triples otherwise the data is corrupt.
            if (triples.size() % 3 == 0) {
              cmState state(cmState::Unknown);
              rt.Backtrace = cmListFileBacktrace();

              // the first entry represents the top of the trace so we need to
              // reconstruct the backtrace in reverse
              for (size_t i = triples.size(); i >= 3; i -= 3) {
                cmListFileContext fc;
                fc.FilePath = triples[i - 3];
                long line = 0;
                if (!cmStrToLong(triples[i - 2], &line)) {
                  line = 0;
                }
                fc.Line = line;
                fc.Name = triples[i - 1];
                rt.Backtrace = rt.Backtrace.Push(fc);
              }
            }
          } else if (key == "WILL_FAIL"_s) {
            rt.WillFail = cmIsOn(val);
          } else if (key == "DISABLED"_s) {
            rt.Disabled = cmIsOn(val);
          } else if (key == "ATTACHED_FILES"_s) {
            cmExpandList(val, rt.AttachedFiles);
          } else if (key == "ATTACHED_FILES_ON_FAIL"_s) {
            cmExpandList(val, rt.AttachOnFail);
          } else if (key == "RESOURCE_LOCK"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.LockedResources.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_SETUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesSetup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_CLEANUP"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesCleanup.insert(lval.begin(), lval.end());
          } else if (key == "FIXTURES_REQUIRED"_s) {
            std::vector<std::string> lval = cmExpandedList(val);

            rt.FixturesRequired.insert(lval.begin(), lval.end());
          } else if (key == "TIMEOUT"_s) {
            rt.Timeout = cmDuration(atof(val.c_str()));
            rt.ExplicitTimeout = true;
          } else if (key == "COST"_s) {
            rt.Cost = static_cast<float>(atof(val.c_str()));
          } else if (key == "REQUIRED_FILES"_s) {
            cmExpandList(val, rt.RequiredFiles);
          } else if (key == "RUN_SERIAL"_s) {
            rt.RunSerial = cmIsOn(val);
          } else if (key == "FAIL_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.ErrorRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "SKIP_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.SkipRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "PROCESSORS"_s) {
            rt.Processors = atoi(val.c_str());
            if (rt.Processors < 1) {
              rt.Processors = 1;
            }
          } else if (key == "PROCESSOR_AFFINITY"_s) {
            rt.WantAffinity = cmIsOn(val);
          } else if (key == "RESOURCE_GROUPS"_s) {
            if (!ParseResourceGroupsProperty(val, rt.ResourceGroups)) {
              return false;
            }
          } else if (key == "SKIP_RETURN_CODE"_s) {
            rt.SkipReturnCode = atoi(val.c_str());
            if (rt.SkipReturnCode < 0 || rt.SkipReturnCode > 255) {
              rt.SkipReturnCode = -1;
            }
          } else if (key == "DEPENDS"_s) {
            cmExpandList(val, rt.Depends);
          } else if (key == "ENVIRONMENT"_s) {
            cmExpandList(val, rt.Environment);
          } else if (key == "ENVIRONMENT_MODIFICATION"_s) {
            cmExpandList(val, rt.EnvironmentModification);
          } else if (key == "LABELS"_s) {
            std::vector<std::string> Labels = cmExpandedList(val);
            rt.Labels.insert(rt.Labels.end(), Labels.begin(), Labels.end());
            // sort the array
            std::sort(rt.Labels.begin(), rt.Labels.end());
            // remove duplicates
            auto new_end = std::unique(rt.Labels.begin(), rt.Labels.end());
            rt.Labels.erase(new_end, rt.Labels.end());
          } else if (key == "MEASUREMENT"_s) {
            size_t pos = val.find_first_of('=');
            if (pos != std::string::npos) {
              std::string mKey = val.substr(0, pos);
              std::string mVal = val.substr(pos + 1);
              rt.Measurements[mKey] = std::move(mVal);
            } else {
              rt.Measurements[val] = "1";
            }
          } else if (key == "PASS_REGULAR_EXPRESSION"_s) {
            std::vector<std::string> lval = cmExpandedList(val);
            for (std::string const& cr : lval) {
              rt.RequiredRegularExpressions.emplace_back(cr, cr);
            }
          } else if (key == "WORKING_DIRECTORY"_s) {
            rt.Directory = val;
          } else if (key == "TIMEOUT_AFTER_MATCH"_s) {
            std::vector<std::string> propArgs = cmExpandedList(val);
            if (propArgs.size() != 2) {
              cmCTestLog(this->CTest, WARNING,
                         "TIMEOUT_AFTER_MATCH expects two arguments, found "
                           << propArgs.size() << std::endl);
            } else {
              rt.AlternateTimeout = cmDuration(atof(propArgs[0].c_str()));
              std::vector<std::string> lval = cmExpandedList(propArgs[1]);
              for (std::string const& cr : lval) {
                rt.TimeoutRegularExpressions.emplace_back(cr, cr);
              }
            }
          }
        }
      }
    }
  }
  return true;
}